

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O1

int Csw_CutFilter(Csw_Man_t *p,Aig_Obj_t *pObj,Csw_Cut_t *pCut)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Csw_Cut_t *pCVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  iVar3 = p->nCutsMax;
  if (iVar3 < 1) {
    return 0;
  }
  pCVar4 = p->pCuts[pObj->Id];
  iVar6 = 0;
  do {
    bVar1 = pCVar4->nFanins;
    uVar7 = (uint)(char)bVar1;
    if (pCVar4 != pCut && 1 < (int)uVar7) {
      bVar2 = pCut->nFanins;
      if ((char)bVar2 < (char)bVar1) {
        if ((pCut->uSign & ~pCVar4->uSign) == 0) {
          if ('\0' < (char)bVar2) {
            uVar10 = 0;
            do {
              if ((char)bVar1 < '\x01') {
                uVar5 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  if (*(int *)((long)&pCut[1].pNext + uVar10 * 4) ==
                      *(int *)((long)&pCVar4[1].pNext + uVar5 * 4)) goto LAB_004e8f64;
                  uVar5 = uVar5 + 1;
                } while (bVar1 != uVar5);
                uVar5 = (ulong)uVar7;
              }
LAB_004e8f64:
              if ((uint)uVar5 == uVar7) goto LAB_004e8f0a;
              uVar10 = uVar10 + 1;
            } while (uVar10 != bVar2);
          }
          pCVar4->nFanins = '\0';
        }
      }
      else if ((pCVar4->uSign & ~pCut->uSign) == 0) {
        if ((char)bVar1 < '\x01') {
LAB_004e8fc4:
          pCut->nFanins = '\0';
          return 1;
        }
        uVar8 = (uint)(char)bVar2;
        lVar9 = 0;
        do {
          if ((char)bVar2 < '\x01') {
            uVar10 = 0;
          }
          else {
            uVar5 = 0;
            do {
              uVar10 = uVar5;
              if (*(int *)((long)&pCVar4[1].pNext + lVar9 * 4) ==
                  *(int *)((long)&pCut[1].pNext + uVar5 * 4)) break;
              uVar5 = uVar5 + 1;
              uVar10 = (ulong)uVar8;
            } while (uVar8 != uVar5);
          }
          if ((uint)uVar10 == uVar8) break;
          lVar9 = lVar9 + 1;
          if (lVar9 == (int)uVar7) goto LAB_004e8fc4;
        } while( true );
      }
    }
LAB_004e8f0a:
    iVar6 = iVar6 + 1;
    pCVar4 = (Csw_Cut_t *)((long)&pCVar4->pNext + (long)pCVar4->nCutSize);
    if (iVar6 == iVar3) {
      return 0;
    }
  } while( true );
}

Assistant:

int Csw_CutFilter( Csw_Man_t * p, Aig_Obj_t * pObj, Csw_Cut_t * pCut )
{ 
    Csw_Cut_t * pTemp;
    int i;
    // go through the cuts of the node
    Csw_ObjForEachCut( p, pObj, pTemp, i )
    {
        if ( pTemp->nFanins < 2 )
            continue;
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nFanins > pCut->nFanins )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Csw_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->nFanins = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Csw_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given
                pCut->nFanins = 0;
                return 1;
            }
        }
    }
    return 0;
}